

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

void group_new_objs(Am_Object *cmd,Am_Value *new_sel)

{
  Am_Object selection_widget;
  Am_Object group;
  Am_Object obj;
  Am_Value_List selected_objs;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Value_List local_30;
  Am_Value local_20;
  
  local_60.data = (Am_Object_Data *)0x0;
  local_58.data = (Am_Object_Data *)0x0;
  local_38.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&local_30);
  Am_Object::Am_Object(&local_48,cmd);
  Am_Get_Selection_Widget_For_Command(&local_40);
  Am_Object::operator=(&local_60,&local_40);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_48);
  Am_Object::Am_Object(&local_50,&local_60);
  Am_Value::Am_Value(&local_20,new_sel);
  Am_Get_Sel_Or_Param_In_Display_Order(&local_50,&local_30,&local_58,&local_20);
  Am_Value::~Am_Value(&local_20);
  Am_Object::~Am_Object(&local_50);
  group_objects_internal(cmd,&local_60,&local_30,&local_58);
  Am_Value_List::~Am_Value_List(&local_30);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_60);
  return;
}

Assistant:

void
group_new_objs(Am_Object &cmd, Am_Value new_sel)
{
  Am_Object selection_widget, group, obj;
  Am_Value_List selected_objs;
  selection_widget = Am_Get_Selection_Widget_For_Command(cmd);
  Am_Get_Sel_Or_Param_In_Display_Order(selection_widget, selected_objs, group,
                                       new_sel);
  group_objects_internal(cmd, selection_widget, selected_objs, group);
}